

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

int bf_rewind(bfile_t *bfile,uint n_bytes)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint in_ESI;
  long in_RDI;
  size_t num_bytes;
  size_t newbuf;
  size_t prevbuf;
  uint local_28;
  
  uVar2 = *(ulong *)(in_RDI + 0x18);
  uVar1 = *(uint *)(in_RDI + 0x38);
  if (*(ulong *)(in_RDI + 0x18) < (ulong)in_ESI) {
    local_28 = (uint)*(undefined8 *)(in_RDI + 0x18);
    *(undefined8 *)(in_RDI + 0x18) = 0;
    fprintf(_stderr,"warning: tried rewinding past beginning of file.\n",uVar2 % (ulong)uVar1);
  }
  else {
    *(ulong *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) - (ulong)in_ESI;
    local_28 = in_ESI;
  }
  uVar3 = *(ulong *)(in_RDI + 0x18) / (ulong)*(uint *)(in_RDI + 0x38);
  if (uVar3 < uVar2 / uVar1) {
    *(ulong *)(in_RDI + 0x20) = uVar3 * *(uint *)(in_RDI + 0x38);
    fseek(*(FILE **)(in_RDI + 8),*(long *)(in_RDI + 0x20),0);
    bf_read_buffer((bfile_t *)prevbuf);
  }
  return local_28;
}

Assistant:

int
bf_rewind(
    bfile_t * bfile,
    unsigned int n_bytes )
{
    size_t prevbuf, newbuf, num_bytes = n_bytes;
    assert( bfile != NULL );
    prevbuf = bfile->pos / bfile->buffer_size;
    if ( num_bytes > bfile->pos ) {
        num_bytes = bfile->pos;
        bfile->pos = 0;
        fprintf( stderr, "warning: tried rewinding past beginning of file.\n" );
    } else {
        bfile->pos -= num_bytes;
    }
    newbuf = bfile->pos / bfile->buffer_size;
    if ( newbuf < prevbuf ) { /* rewinded past block boundary */
        /* refresh "preloaded" buffer with old buffer */
        bfile->ipos = newbuf * bfile->buffer_size;
        fseek( bfile->file, (long)bfile->ipos, SEEK_SET );
        bf_read_buffer( bfile );
    }
    return (int)num_bytes;
}